

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.c
# Opt level: O0

int try_match(char *pattern,char *subject)

{
  FILE *pFVar1;
  regex_handle rVar2;
  char *pcVar3;
  int local_2c;
  int ret;
  regex_handle re;
  char *subject_local;
  char *pattern_local;
  
  re.priv = subject;
  memset(&stack0xffffffffffffffd8,0,8);
  pattern_local._4_4_ = regex_init((regex_handle *)&stack0xffffffffffffffd8);
  pFVar1 = _stderr;
  if (pattern_local._4_4_ < 0) {
    pcVar3 = strerror(-pattern_local._4_4_);
    fprintf(pFVar1,"Error: Failed to initialize regex (%d): %s\n",(ulong)(uint)-pattern_local._4_4_,
            pcVar3);
  }
  else {
    local_2c = regex_compile((regex_handle *)&stack0xffffffffffffffd8,pattern);
    pFVar1 = _stderr;
    if (local_2c < 0) {
      pcVar3 = strerror(-local_2c);
      fprintf(pFVar1,"Error: Failed to compile regex \'%s\' (%d): %s\n",pattern,
              (ulong)(uint)-local_2c,pcVar3);
    }
    else {
      local_2c = regex_is_match((regex_handle *)&stack0xffffffffffffffd8,(char *)re.priv);
      rVar2 = re;
      pFVar1 = _stderr;
      if (local_2c < 0) {
        pcVar3 = strerror(-local_2c);
        fprintf(pFVar1,"Error: Failed to match \'%s\' against \'%s\' (%d): %s\n",rVar2.priv,pattern,
                (ulong)(uint)-local_2c,pcVar3);
      }
    }
    regex_free((regex_handle *)&stack0xffffffffffffffd8);
    pattern_local._4_4_ = local_2c;
  }
  return pattern_local._4_4_;
}

Assistant:

static int try_match(const char * const pattern, const char * const subject)
{
	struct regex_handle re;
	int ret;

	memset(&re, 0x0, sizeof(struct regex_handle));

	ret = regex_init(&re);
	if (ret < 0) {
		fprintf(stderr, "Error: Failed to initialize regex (%d): %s\n",
			-ret, strerror(-ret));
		return ret;
	}

	ret = regex_compile(&re, pattern);
	if (ret < 0) {
		fprintf(stderr,
			"Error: Failed to compile regex '%s' (%d): %s\n",
			pattern, -ret, strerror(-ret));
		goto try_match_exit;
	}

	ret = regex_is_match(&re, subject);
	if (ret < 0)
		fprintf(stderr,
			"Error: Failed to match '%s' against '%s' (%d): %s\n",
			subject, pattern, -ret, strerror(-ret));

try_match_exit:
	regex_free(&re);

	return ret;
}